

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void Input::handleMousePosition(GLFWwindow *window,double xpos,double ypos)

{
  Input *pIVar1;
  double ypos_local;
  double xpos_local;
  GLFWwindow *window_local;
  
  pIVar1 = getInstance();
  pIVar1->mouseX = (float)xpos;
  pIVar1 = getInstance();
  pIVar1->mouseY = (float)ypos;
  return;
}

Assistant:

void Input::handleMousePosition(GLFWwindow * window, double xpos, double ypos)
{
	Input::getInstance()->mouseX = (float)xpos;
	Input::getInstance()->mouseY = (float)ypos;
}